

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

archive_wstring * archive_wstrncat(archive_wstring *as,wchar_t *p,size_t n)

{
  archive_wstring *paVar1;
  size_t sVar2;
  size_t s;
  
  if (n == 0) {
    s = 0;
  }
  else {
    sVar2 = 0;
    do {
      s = sVar2;
      if (p[sVar2] == L'\0') break;
      sVar2 = sVar2 + 1;
      s = n;
    } while (n != sVar2);
  }
  paVar1 = archive_wstring_append(as,p,s);
  if (paVar1 == (archive_wstring *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  return paVar1;
}

Assistant:

struct archive_wstring *
archive_wstrncat(struct archive_wstring *as, const wchar_t *p, size_t n)
{
	size_t s;
	const wchar_t *pp;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_wstring_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}